

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

int __thiscall SPSUnit::mvc_vui_parameters_extension(SPSUnit *this)

{
  BitStreamReader *this_00;
  vector<HRDParams,_std::allocator<HRDParams>_> *this_01;
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  pointer pHVar7;
  ulong __new_size;
  long lVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vui_mvc_temporal_id;
  
  uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
  if (uVar4 + 1 < 0x401) {
    vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __new_size = (ulong)(uVar4 + 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&vui_mvc_temporal_id,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(&this->mvcHrdParamsBitPos,__new_size);
    this_01 = &this->mvcNalHrdParams;
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize(this_01,__new_size);
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize(&this->mvcVclHrdParams,__new_size);
    this_00 = &(this->super_NALUnit).bitReader;
    for (uVar6 = 0; uVar6 != __new_size; uVar6 = uVar6 + 1) {
      uVar4 = BitStreamReader::getBits(this_00,3);
      vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = (uchar)uVar4;
      uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      if (0x400 < uVar4 + 1) break;
      lVar8 = (ulong)(uVar4 + 1) + 1;
      while (lVar8 = lVar8 + -1, lVar8 != 0) {
        uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
        if (0x3ff < uVar4) goto LAB_001cbede;
      }
      bVar3 = BitStreamReader::getBit(this_00);
      if (bVar3) {
        BitStreamReader::skipBits(this_00,0x20);
        BitStreamReader::skipBits(this_00,0x20);
        BitStreamReader::skipBit(this_00);
      }
      (this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] =
           ((*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
            *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8 -
           (this->super_NALUnit).bitReader.m_bitLeft) + 0x40;
      bVar3 = BitStreamReader::getBit(this_00);
      pHVar7 = (this_01->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pHVar7[uVar6].isPresent = bVar3;
      if (bVar3) {
        iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
        uVar4 = (this->super_NALUnit).bitReader.m_bitLeft;
        iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer;
        iVar5 = hrd_parameters(this,pHVar7 + uVar6);
        if (iVar5 != 0) break;
        (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6].bitLen =
             (((iVar1 - iVar2) * 8 + uVar4) - (this->super_NALUnit).bitReader.m_bitLeft) +
             (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
             *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
      }
      bVar3 = BitStreamReader::getBit(this_00);
      pHVar7 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar7[uVar6].isPresent = bVar3;
      if (bVar3) {
        iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
        uVar4 = (this->super_NALUnit).bitReader.m_bitLeft;
        iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer;
        iVar5 = hrd_parameters(this,pHVar7 + uVar6);
        if (iVar5 != 0) break;
        pHVar7 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pHVar7[uVar6].bitLen =
             (((iVar1 - iVar2) * 8 + uVar4) - (this->super_NALUnit).bitReader.m_bitLeft) +
             (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
             *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
      }
      if (((this_01->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar6].isPresent != false) ||
         (pHVar7[uVar6].isPresent == true)) {
        BitStreamReader::skipBit(this_00);
      }
      BitStreamReader::skipBit(this_00);
    }
LAB_001cbede:
    uVar4 = (uint)(uVar6 < __new_size);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vui_mvc_temporal_id.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int SPSUnit::mvc_vui_parameters_extension()
{
    const unsigned vui_mvc_num_ops = extractUEGolombCode() + 1;
    if (vui_mvc_num_ops > 1 << 10)
        return 1;
    std::vector<uint8_t> vui_mvc_temporal_id;
    vui_mvc_temporal_id.resize(vui_mvc_num_ops);
    mvcHrdParamsBitPos.resize(vui_mvc_num_ops);
    mvcNalHrdParams.resize(vui_mvc_num_ops);
    mvcVclHrdParams.resize(vui_mvc_num_ops);

    for (size_t i = 0; i < vui_mvc_num_ops; i++)
    {
        vui_mvc_temporal_id[i] = bitReader.getBits<uint8_t>(3);
        const unsigned vui_mvc_num_target_output_views = extractUEGolombCode() + 1;
        if (vui_mvc_num_target_output_views > 1 << 10)
            return 1;
        for (size_t j = 0; j < vui_mvc_num_target_output_views; j++)
            if (extractUEGolombCode() >= 1 << 10)  // vui_mvc_view_id[ i ][ j ]
                return 1;

        if (bitReader.getBit())  // vui_mvc_timing_info_present_flag[ i ]
        {
            bitReader.skipBits(32);  // vui_mvc_num_units_in_tick[i]
            bitReader.skipBits(32);  // vui_mvc_time_scale[ i ]
            bitReader.skipBit();     // vui_mvc_fixed_frame_rate_flag[ i ]
        }

        mvcHrdParamsBitPos[i] = bitReader.getBitsCount() + 32;
        mvcNalHrdParams[i].isPresent = bitReader.getBit();
        if (mvcNalHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcNalHrdParams[i]) != 0)
                return 1;
            mvcNalHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        mvcVclHrdParams[i].isPresent = bitReader.getBit();
        if (mvcVclHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcVclHrdParams[i]) != 0)
                return 1;
            mvcVclHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        if (mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
            bitReader.skipBit();  // vui_mvc_low_delay_hrd_flag[i]
        bitReader.skipBit();      // vui_mvc_pic_struct_present_flag[i]
    }
    return 0;
}